

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O3

int UNPK_seek(PHYSFS_Io *io,PHYSFS_uint64 offset)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)io->opaque;
  if (offset < *(ulong *)(plVar1[1] + 0x30)) {
    iVar2 = (**(code **)(*plVar1 + 0x20))(*plVar1,*(long *)(plVar1[1] + 0x28) + offset);
    if (iVar2 != 0) {
      *(int *)(plVar1 + 2) = (int)offset;
      return iVar2;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_PAST_EOF);
  }
  return 0;
}

Assistant:

static int UNPK_seek(PHYSFS_Io *io, PHYSFS_uint64 offset)
{
    UNPKfileinfo *finfo = (UNPKfileinfo *) io->opaque;
    const UNPKentry *entry = finfo->entry;
    int rc;

    BAIL_IF(offset >= entry->size, PHYSFS_ERR_PAST_EOF, 0);
    rc = finfo->io->seek(finfo->io, entry->startPos + offset);
    if (rc)
        finfo->curPos = (PHYSFS_uint32) offset;

    return rc;
}